

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::openImageFileInNewWindow(UEFITool *this)

{
  bool bVar1;
  QString local_b8;
  QList<QString> local_a0;
  uint local_84;
  QString local_80;
  QFlags<QFileDialog::Option> local_68 [4];
  QString local_58;
  QString local_40;
  undefined1 local_28 [8];
  QString path;
  UEFITool *this_local;
  
  path.d.size = (qsizetype)this;
  tr(&local_40,"Open BIOS image file in new window",(char *)0x0,-1);
  tr(&local_58,"BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)",
     (char *)0x0,-1);
  QFlags<QFileDialog::Option>::QFlags(local_68);
  QFileDialog::getOpenFileName
            ((QWidget *)local_28,(QString *)this,(QString *)&local_40,(QString *)&this->currentDir,
             (QString *)&local_58,(QFlags_conflict1 *)0x0);
  QString::~QString(&local_58);
  QString::~QString(&local_40);
  QString::trimmed(&local_80,(QString *)local_28);
  bVar1 = QString::isEmpty(&local_80);
  QString::~QString(&local_80);
  if (!bVar1) {
    QList<QString>::QList<QString,void>(&local_a0,(QString *)local_28);
    QString::QString(&local_b8);
    QProcess::startDetached
              ((QString *)&this->currentProgramPath,(QList_conflict *)&local_a0,(QString *)&local_b8
               ,(longlong *)0x0);
    QString::~QString(&local_b8);
    QList<QString>::~QList(&local_a0);
  }
  local_84 = (uint)bVar1;
  QString::~QString((QString *)local_28);
  return;
}

Assistant:

void UEFITool::openImageFileInNewWindow()
{
    QString path = QFileDialog::getOpenFileName(this, tr("Open BIOS image file in new window"), currentDir, tr("BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)"));
    if (path.trimmed().isEmpty())
        return;
    QProcess::startDetached(currentProgramPath, QStringList(path));
}